

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_files.cpp
# Opt level: O3

int main(void)

{
  FILE *__stream;
  uint uVar1;
  FILE *__stream_00;
  
  __stream_00 = fopen("../../examples/example_files.cpp","r");
  __stream = _stdout;
  uVar1 = getc(__stream_00);
  uVar1 = uVar1 & 0xff;
  if (uVar1 != 0xff) {
    while( true ) {
      fputc(uVar1,__stream);
      uVar1 = getc(__stream_00);
      if ((char)uVar1 == -1) break;
      uVar1 = uVar1 & 0xff;
    }
  }
  fclose(__stream_00);
  return 0;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(100);

    // the simple cat program. Simply reads until such a time as it gets code -1 (EOF)
    BRAIN_PROGRAM file_cat = BRAIN_COMPILE(,+[-.,+]);

    // This path works for me. It might not for you. Sorry about that.
    FILE* self = fopen("../../examples/example_files.cpp", "r");

    int status_code = file_cat.exec(data, 0, stdout, self);

    fclose(self);

    delete[] data;

    return status_code;
}